

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O3

QBitArray * __thiscall QBitArray::operator&=(QBitArray *this,QBitArray *other)

{
  anon_enum_32 aVar1;
  
  aVar1 = prepareForBitwiseOperation(this,other);
  if (aVar1 == Endian) {
    performBitwiseOperationInCopy<std::bit_and<unsigned_char>>(this,other);
  }
  else {
    performBitwiseOperationInPlace<std::bit_and<unsigned_char>>();
  }
  return this;
}

Assistant:

QBitArray &QBitArray::operator&=(QBitArray &&other)
{
    return performBitwiseOperation(*this, other, std::bit_and<uchar>());
}